

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  LYS_NODE LVar1;
  lyd_node *plVar2;
  lyxp_expr *plVar3;
  ushort uVar4;
  ushort uVar5;
  lyxp_set_type lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  lyd_node *plVar10;
  lyd_node *node;
  lys_node *plVar11;
  lyxp_set_node *plVar12;
  char *pcVar13;
  lys_module *plVar14;
  long lVar15;
  lys_module *plVar16;
  lys_node *plVar17;
  lys_node *plVar18;
  ulong uVar19;
  lyxp_set *plVar20;
  lys_node *plVar21;
  lyxp_token lVar22;
  ly_ctx *plVar23;
  char *pcVar24;
  ulong uVar25;
  lyxp_node_type lVar26;
  uint uVar27;
  lyxp_set *plVar28;
  ushort *puVar29;
  lyd_attr **pplVar30;
  LY_ECODE ecode;
  ulong uVar31;
  ly_ctx *ctx;
  undefined8 uVar32;
  lyxp_node_type lVar33;
  lys_module *plVar34;
  lyd_node *plVar35;
  char *pcVar36;
  bool bVar37;
  lys_module *local_b0;
  lyxp_node_type local_94;
  lys_module *local_90;
  lys_module *local_88;
  lyxp_expr *local_80;
  ushort *local_78;
  char *local_70;
  ly_ctx *local_68;
  lyxp_node_type local_5c;
  char cStack_58;
  undefined7 uStack_57;
  uint32_t mod_idx;
  lys_module *local_50;
  lyxp_set *local_48;
  lys_node *local_40;
  char local_31;
  
  pcVar36 = (char *)(ulong)(uint)all_desc;
  pcVar24 = "parsed";
  if (set == (lyxp_set *)0x0) {
    pcVar24 = "skipped";
  }
  local_31 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  uVar4 = *exp_idx;
  plVar28 = set;
  local_90 = param_4;
  local_80 = exp;
  local_78 = exp_idx;
  local_48 = set;
  local_40 = (lys_node *)cur_node;
  do {
    uVar8 = (uint)set;
    uVar19 = (ulong)uVar4;
    lVar22 = exp->tokens[uVar19];
    switch(lVar22) {
    case LYXP_TOKEN_DOT:
      if (local_31 == '\0') {
        lVar6 = moveto_snode_self(plVar28,local_40,all_desc,options);
      }
      else {
        lVar6 = moveto_self(plVar28,(lyd_node *)local_40,all_desc,options);
      }
      break;
    case LYXP_TOKEN_DDOT:
      if (local_31 == '\0') {
        lVar6 = plVar28->type;
        if (lVar6 != LYXP_SET_EMPTY) {
          if (lVar6 == LYXP_SET_SNODE_SET) {
            if (all_desc != 0) {
              iVar7 = moveto_snode_self(plVar28,local_40,1,options);
              lVar6 = ~LYXP_SET_EMPTY;
              if (iVar7 != 0) break;
            }
            plVar21 = moveto_snode_get_root(local_40,options,&local_5c);
            uVar8 = plVar28->used;
            uVar19 = 0;
            _cStack_58 = (ly_ctx *)CONCAT44(mod_idx,uVar8);
            uVar25 = 0;
            if (0 < (int)uVar8) {
              uVar25 = (ulong)uVar8;
            }
            local_50 = (lys_module *)((ulong)local_50 & 0xffffffff00000000);
            for (; uVar19 != uVar25; uVar19 = uVar19 + 1) {
              if ((local_48->val).nodes[uVar19].pos == 1) {
                (local_48->val).nodes[uVar19].pos = 0;
                if ((local_48->val).nodes[uVar19].type == LYXP_NODE_ELEM) {
                  plVar18 = (lys_node *)(local_48->val).nodes[uVar19].node;
                  plVar11 = plVar18;
                  do {
                    plVar11 = lys_parent(plVar11);
                    if (plVar11 == (lys_node *)0x0) {
                      if (plVar21 == plVar18) goto LAB_00173b26;
                      if (((options & 0x18U) == 0) ||
                         (lVar33 = LYXP_NODE_ROOT_CONFIG,
                         ((ulong)*(lyd_node **)&local_40->flags & 1) == 0)) {
                        lVar33 = LYXP_NODE_ROOT;
                      }
                      plVar14 = lys_node_module(plVar18);
                      plVar18 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar14,0x100);
                      plVar11 = plVar21;
                      if (plVar18 != plVar21) {
                        ly_log(local_40->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                               ,0x1972);
                      }
                      goto LAB_00173b40;
                    }
                  } while ((plVar11->nodetype & (LYS_USES|LYS_OUTPUT|LYS_INPUT|LYS_CASE|LYS_CHOICE))
                           != LYS_UNKNOWN);
                  lVar33 = LYXP_NODE_ELEM;
                  if (plVar21 == plVar18) {
LAB_00173b26:
                    if (((options & 0x18U) == 0) ||
                       (((ulong)*(lyd_node **)&local_40->flags & 1) == 0)) {
                      lVar33 = LYXP_NODE_ROOT;
                      plVar11 = plVar18;
                    }
                    else {
                      lVar33 = LYXP_NODE_ROOT_CONFIG;
                      plVar11 = plVar18;
                    }
LAB_00173b40:
                    if ((lVar33 != local_5c) || (plVar11 != plVar21)) {
                      __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                    ,0x197c,
                                    "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                                   );
                    }
                  }
                  iVar7 = set_snode_insert_node(local_48,plVar11,lVar33);
                  if ((long)uVar19 < (long)iVar7 && iVar7 < (int)_cStack_58) {
                    (local_48->val).nodes[iVar7].pos = 2;
                    local_50 = (lys_module *)CONCAT44(local_50._4_4_,1);
                  }
                }
              }
            }
            lVar6 = LYXP_SET_EMPTY;
            plVar28 = local_48;
            if ((uint)local_50 != 0) {
              for (lVar15 = 0; uVar25 * 0x10 != lVar15; lVar15 = lVar15 + 0x10) {
                if (*(int *)((long)&((local_48->val).nodes)->pos + lVar15) == 2) {
                  *(undefined4 *)((long)&((local_48->val).nodes)->pos + lVar15) = 1;
                }
              }
            }
          }
          else {
            plVar14 = (lys_module *)local_40->module->ctx;
LAB_00173e42:
            pcVar36 = print_set_type(plVar28);
            ly_vlog((ly_ctx *)plVar14,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",
                    pcVar36);
            lVar6 = ~LYXP_SET_EMPTY;
          }
        }
      }
      else if (plVar28 == (lyxp_set *)0x0) {
LAB_001740ab:
        lVar6 = LYXP_SET_EMPTY;
      }
      else {
        lVar6 = plVar28->type;
        if (lVar6 != LYXP_SET_EMPTY) {
          plVar14 = (lys_module *)**(undefined8 **)(local_40->name + 0x30);
          if (lVar6 != LYXP_SET_NODE_SET) goto LAB_00173e42;
          if ((all_desc == 0) ||
             (lVar6 = moveto_self(plVar28,(lyd_node *)local_40,1,options), lVar6 == LYXP_SET_EMPTY))
          {
            plVar21 = local_40;
            local_50 = plVar14;
            plVar10 = moveto_get_root((lyd_node *)local_40,options,&local_5c);
            lVar33 = LYXP_NODE_ROOT;
            _cStack_58 = (ly_ctx *)CONCAT44(mod_idx,local_5c);
            do {
              plVar28 = local_48;
LAB_001736b0:
              while( true ) {
                plVar20 = local_48;
                if (plVar28->used <= lVar33) {
                  iVar7 = set_sort(plVar28,(lyd_node *)plVar21,options);
                  if (iVar7 != 0) goto LAB_00174d10;
                  uVar8 = plVar28->used;
                  if (uVar8 < 2) goto LAB_001740ab;
                  bVar37 = true;
                  uVar19 = 0;
                  goto LAB_00174052;
                }
                plVar2 = (plVar28->val).nodes[lVar33].node;
                lVar26 = (plVar28->val).nodes[lVar33].type;
                if (lVar26 == LYXP_NODE_ATTR) break;
                node = plVar2;
                if (lVar26 == LYXP_NODE_TEXT) goto LAB_0017370e;
                if (lVar26 == LYXP_NODE_ELEM) {
                  node = ((lyd_val *)&plVar2->parent)->instance;
                  goto LAB_0017370e;
                }
                set_remove_node(local_48,lVar33);
                plVar28 = plVar20;
              }
              node = lyd_attr_parent(plVar10,(lyd_attr *)plVar2);
              if (node == (lyd_node *)0x0) {
                ly_log((ly_ctx *)local_50,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                       ,0x18f8);
                lVar6 = ~LYXP_SET_EMPTY;
                plVar28 = local_48;
                break;
              }
LAB_0017370e:
              if ((((options & 2U) != 0) && (node != (lyd_node *)0x0)) &&
                 ((node->field_0x9 & 0xe) == 8)) {
                lVar6 = LYXP_SET_NODE_SET;
                plVar28 = local_48;
                break;
              }
              if (plVar10 == plVar2) {
                if ((options == 0) || ((((lys_node *)plVar21->name)->flags & 1) == 0)) {
                  lVar26 = LYXP_NODE_ROOT;
                  node = plVar2;
                }
                else {
                  lVar26 = LYXP_NODE_ROOT_CONFIG;
                  node = plVar2;
                }
LAB_001737a7:
                if ((lVar26 != _cStack_58) || (lVar26 = _cStack_58, node != plVar10)) {
                  __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                ,0x1923,
                                "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)")
                  ;
                }
              }
              else {
                lVar26 = LYXP_NODE_ELEM;
                if (node == (lyd_node *)0x0) {
                  if ((options == 0) ||
                     (lVar26 = LYXP_NODE_ROOT_CONFIG, (((lys_node *)local_40->name)->flags & 1) == 0
                     )) {
                    lVar26 = LYXP_NODE_ROOT;
                  }
                  do {
                    plVar35 = plVar2;
                    plVar2 = plVar35->prev;
                  } while (plVar2->next != (lyd_node *)0x0);
                  node = plVar10;
                  if (plVar35 != plVar10) {
                    pcVar36 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ;
                    ly_log((ly_ctx *)local_50,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                           ,0x1919);
                  }
                  goto LAB_001737a7;
                }
              }
              plVar28 = local_48;
              iVar7 = set_dup_node_check(local_48,node,lVar26,-1);
              if (iVar7 != 0) {
                set_remove_node(plVar28,lVar33);
                plVar28 = local_48;
                plVar21 = local_40;
                goto LAB_001736b0;
              }
              set_replace_node(plVar28,node,lVar26,lVar33,(uint32_t)pcVar36);
              lVar33 = lVar33 + LYXP_NODE_ROOT_CONFIG;
              plVar21 = local_40;
            } while( true );
          }
        }
      }
      break;
    case LYXP_TOKEN_AT:
      uVar8 = (uint)exp->expr_pos[uVar19];
      bVar37 = false;
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar24);
      uVar4 = *exp_idx;
      *exp_idx = uVar4 + 1;
      uVar19 = (ulong)(ushort)(uVar4 + 1);
      lVar22 = exp->tokens[uVar19];
      goto LAB_00173870;
    default:
      if (local_90 == (lys_module *)0x0) {
        plVar23 = (ly_ctx *)0x0;
      }
      else {
        plVar23 = local_90->ctx;
      }
      uVar32 = 0x1c47;
LAB_00174b69:
      ly_log(plVar23,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,uVar32);
      return -1;
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      bVar37 = true;
LAB_00173870:
      plVar21 = local_40;
      plVar14 = local_90;
      if (lVar22 == LYXP_TOKEN_NODETYPE) {
        pcVar36 = "skipped";
        if (plVar28 != (lyxp_set *)0x0) {
          if (exp->tok_len[uVar19] != 4) {
            __assert_fail("exp->tok_len[*exp_idx] == 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x1b0e,
                          "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                         );
          }
          lVar6 = local_48->type;
          if (lVar6 == LYXP_SET_SNODE_SET) {
            set_snode_clear_ctx(local_48);
            pcVar36 = "skipped";
          }
          else {
            uVar4 = exp->expr_pos[uVar19];
            pcVar36 = exp->expr;
            iVar7 = strncmp(pcVar36 + uVar4,"node",4);
            if (iVar7 == 0) {
              if ((options & 0x1cU) != 0) goto LAB_00173d4f;
              pcVar36 = "parsed";
              if (lVar6 == LYXP_SET_NODE_SET) goto LAB_00173d5f;
              lyxp_set_cast(local_48,LYXP_SET_EMPTY,(lyd_node *)plVar21,plVar14,options);
            }
            else {
              iVar7 = strncmp(pcVar36 + uVar4,"text",4);
              plVar28 = local_48;
              if (iVar7 != 0) {
                __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1b19,
                              "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                             );
              }
              if ((options & 0x1cU) == 0) {
                pcVar36 = "parsed";
                if (lVar6 != LYXP_SET_EMPTY) {
                  if (lVar6 == LYXP_SET_NODE_SET) {
                    uVar8 = 0;
LAB_00173c1e:
LAB_00173c20:
                    do {
                      if (plVar28->used <= uVar8) goto LAB_00173d58;
                      lVar33 = (plVar28->val).nodes[uVar8].type;
                    } while (LYXP_NODE_ATTR < lVar33);
                    if (lVar33 == LYXP_NODE_ELEM) {
                      plVar12 = (plVar28->val).nodes + uVar8;
                      plVar10 = plVar12->node;
                      if ((char)plVar10->validity < '\0') {
                        ly_vlog(plVar14->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar10,
                                plVar10->schema->name);
                        return -1;
                      }
                      if (((plVar10->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                         (plVar10->ht != (hash_table *)0x0)) goto code_r0x00173c6f;
                    }
                    set_remove_node(plVar28,uVar8);
                    goto LAB_00173c20;
                  }
                  plVar23 = plVar14->ctx;
                  pcVar36 = print_set_type(local_48);
                  pcVar24 = "text()";
                  ecode = LYE_XPATH_INCTX;
                  goto LAB_00174bea;
                }
                goto LAB_00173d5f;
              }
LAB_00173d4f:
              set_snode_clear_ctx(local_48);
            }
LAB_00173d58:
            pcVar36 = "parsed";
          }
        }
LAB_00173d5f:
        puVar29 = local_78;
        pcVar13 = print_token(exp->tokens[*local_78]);
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar36,pcVar13,
                   (ulong)exp->expr_pos[*puVar29]);
        uVar4 = *puVar29 + 1;
        *puVar29 = uVar4;
        if (exp->tokens[uVar4] != LYXP_TOKEN_PAR1) {
          __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1b25,
                        "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                       );
        }
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar36,"(",(ulong)exp->expr_pos[uVar4]);
        uVar4 = *puVar29 + 1;
        *puVar29 = uVar4;
        if (exp->tokens[uVar4] != LYXP_TOKEN_PAR2) {
          __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1b2b,
                        "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                       );
        }
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar36,")",(ulong)exp->expr_pos[uVar4]);
        puVar29 = local_78;
        plVar28 = local_48;
      }
      else {
        if (lVar22 != LYXP_TOKEN_NAMETEST) {
          if (local_90 == (lys_module *)0x0) {
            plVar23 = (ly_ctx *)0x0;
          }
          else {
            plVar23 = local_90->ctx;
          }
          uVar32 = 0x1b32;
          goto LAB_00174b69;
        }
        if (bVar37) {
          uVar19 = (ulong)(uint)((int)uVar19 * 2);
          pcVar36 = exp->expr + *(ushort *)((long)exp->expr_pos + uVar19);
          uVar4 = *(ushort *)((long)exp->tok_len + uVar19);
          uVar19 = (ulong)uVar4;
          uVar27 = (uint)uVar4;
          if (all_desc == 0) {
            if (local_31 == '\0') {
              if (plVar28->type == LYXP_SET_EMPTY) goto LAB_001742b7;
              plVar23 = local_40->module->ctx;
              if (plVar28->type != LYXP_SET_SNODE_SET) goto LAB_00173f9a;
              local_68 = plVar23;
              moveto_snode_get_root(local_40,options,&local_94);
              local_70 = pcVar36;
              pcVar13 = strnchr(pcVar36,0x3a,(uint)uVar4);
              plVar23 = local_68;
              if (pcVar13 == (char *)0x0) {
                if ((uVar4 == 1) && (*local_70 == '*')) {
                  uVar19 = 1;
                  plVar14 = (lys_module *)0x0;
                  pcVar36 = local_70;
                }
                else {
                  plVar14 = lys_node_module(plVar21);
                  plVar23 = local_68;
                }
              }
              else {
                uVar27 = (int)pcVar13 - (int)local_70;
                plVar14 = moveto_resolve_model(local_70,(uint16_t)uVar27,local_68,plVar21,1,uVar8);
                pcVar36 = local_70;
                if (plVar14 == (lys_module *)0x0) goto LAB_00174717;
                uVar19 = (ulong)(~uVar27 + (uint)uVar4);
                pcVar36 = local_70 + (long)(int)uVar27 + 1;
              }
              pcVar36 = lydict_insert(plVar23,pcVar36,uVar19 & 0xffff);
              uVar8 = plVar28->used;
              plVar34 = (lys_module *)0x0;
              _cStack_58 = (ly_ctx *)CONCAT44(mod_idx,uVar8);
              local_88 = (lys_module *)0x0;
              if (0 < (int)uVar8) {
                local_88 = (lys_module *)(ulong)uVar8;
              }
              local_70 = (char *)((ulong)local_70 & 0xffffffff00000000);
              for (; plVar21 = local_40, plVar34 != local_88;
                  plVar34 = (lys_module *)((long)&plVar34->ctx + 1)) {
                if ((plVar28->val).nodes[(long)plVar34].pos == 1) {
                  (plVar28->val).nodes[(long)plVar34].pos = 0;
                  if ((plVar28->val).nodes[(long)plVar34].type < LYXP_NODE_ELEM) {
                    local_5c = LYXP_NODE_ROOT;
                    plVar16 = plVar14;
                    do {
                      plVar14 = plVar16;
                      if ((plVar14 == (lys_module *)0x0) &&
                         (plVar14 = ly_ctx_get_module_iter(local_68,&local_5c),
                         plVar14 == (lys_module *)0x0)) {
                        plVar14 = (lys_module *)0x0;
                        break;
                      }
                      plVar21 = (lys_node *)0x0;
                      while (plVar21 = lys_getnext(plVar21,(lys_node *)0x0,plVar14,0x100),
                            plVar21 != (lys_node *)0x0) {
                        iVar7 = moveto_snode_check(plVar21,local_94,pcVar36,plVar14,options);
                        if (iVar7 == 0) {
                          iVar7 = set_snode_insert_node(plVar28,plVar21,LYXP_NODE_ELEM);
                          if ((long)plVar34 < (long)iVar7 && iVar7 < (int)_cStack_58) {
                            (plVar28->val).nodes[iVar7].pos = 2;
                            local_70 = (char *)CONCAT44(local_70._4_4_,1);
                          }
                        }
                      }
                      plVar16 = (lys_module *)0x0;
                    } while (local_5c != LYXP_NODE_ROOT);
                  }
                  else {
                    plVar18 = (lys_node *)(plVar28->val).nodes[(long)plVar34].node;
                    if ((plVar18->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                      local_50 = plVar14;
                      if (plVar14 == (lys_module *)0x0) {
                        plVar14 = lys_node_module(local_40);
                        if ((plVar14->field_0x40 & 0x80) == 0) {
                          plVar16 = lys_node_module(plVar21);
                          plVar21 = (lys_node *)0x0;
                          goto LAB_001748d3;
                        }
                        local_b0 = (lys_module *)0x0;
                        plVar21 = (lys_node *)0x0;
                      }
                      else {
                        plVar21 = (lys_node *)0x0;
                        local_b0 = (lys_module *)0x0;
                        plVar16 = plVar14;
                        if ((plVar14->field_0x40 & 0x80) == 0) goto LAB_001748d3;
                      }
                      while( true ) {
                        plVar11 = plVar21;
                        if (plVar21 == (lys_node *)0x0) {
                          plVar11 = plVar18;
                        }
                        plVar17 = (lys_node *)0x0;
                        while (plVar17 = lys_getnext(plVar17,plVar11,(lys_module *)0x0,0x100),
                              lVar33 = local_94, plVar17 != (lys_node *)0x0) {
                          plVar14 = local_50;
                          if (local_50 == (lys_module *)0x0) {
                            plVar14 = lys_node_module(local_40);
                          }
                          iVar7 = moveto_snode_check(plVar17,lVar33,pcVar36,plVar14,options);
                          plVar28 = local_48;
                          if (iVar7 == 0) {
                            iVar7 = set_snode_insert_node(local_48,plVar17,LYXP_NODE_ELEM);
                            if ((long)plVar34 < (long)iVar7 && iVar7 < (int)_cStack_58) {
                              (plVar28->val).nodes[iVar7].pos = 2;
                              local_70 = (char *)CONCAT44(local_70._4_4_,1);
                            }
                          }
                        }
                        plVar14 = local_50;
                        plVar16 = local_b0;
                        if (plVar21 == (lys_node *)0x0) break;
LAB_001748d3:
                        plVar21 = (lys_node *)
                                  lys_getnext_target_aug
                                            ((lys_node_augment *)plVar21,plVar16,plVar18);
                        local_b0 = plVar16;
                      }
                    }
                  }
                }
              }
              lydict_remove(local_68,pcVar36);
              iVar7 = 0;
              if ((int)local_70 != 0) {
                local_88 = (lys_module *)((long)local_88 << 4);
                for (plVar14 = (lys_module *)0x0; iVar7 = 0, local_88 != plVar14;
                    plVar14 = (lys_module *)&plVar14->prefix) {
                  if (*(int *)((long)&((plVar28->val).nodes)->pos + (long)plVar14) == 2) {
                    *(undefined4 *)((long)&((plVar28->val).nodes)->pos + (long)plVar14) = 1;
                  }
                }
              }
            }
            else {
              iVar7 = moveto_node(plVar28,(lyd_node *)local_40,pcVar36,uVar4,options);
            }
          }
          else if (local_31 == '\0') {
            if (plVar28->type != LYXP_SET_EMPTY) {
              plVar23 = local_40->module->ctx;
              if (plVar28->type != LYXP_SET_SNODE_SET) {
LAB_00173f9a:
                pcVar36 = print_set_type(plVar28);
                ly_vlog(plVar23,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar36);
LAB_00173fc0:
                iVar7 = -1;
                goto LAB_001742ba;
              }
              _cStack_58 = plVar23;
              moveto_snode_get_root(local_40,options,&local_5c);
              pcVar13 = strnchr(pcVar36,0x3a,(uint)uVar4);
              if (pcVar13 == (char *)0x0) {
                plVar14 = (lys_module *)0x0;
              }
              else {
                pcVar13 = strnchr(pcVar36,0x3a,(uint)uVar4);
                uVar27 = (int)pcVar13 - (int)pcVar36;
                plVar14 = moveto_resolve_model(pcVar36,(uint16_t)uVar27,_cStack_58,plVar21,1,uVar8);
                plVar23 = _cStack_58;
                if (plVar14 == (lys_module *)0x0) {
LAB_00174717:
                  ly_vlog(plVar23,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar27,pcVar36);
                  goto LAB_00173fc0;
                }
                pcVar36 = pcVar36 + (long)(int)uVar27 + 1;
                uVar27 = ~uVar27 + (uint)uVar4;
              }
              if ((short)uVar27 == 1) {
                _cStack_58 = (ly_ctx *)
                             CONCAT44(mod_idx,(int)CONCAT71((int7)((ulong)plVar14 >> 8),
                                                            *pcVar36 == '*'));
              }
              else {
                _cStack_58 = (ly_ctx *)((ulong)mod_idx << 0x20);
              }
              local_68 = (ly_ctx *)(ulong)(uVar27 & 0xffff);
              uVar8 = plVar28->used;
              if ((int)plVar28->used < 1) {
                uVar8 = 0;
              }
              local_50 = (lys_module *)(ulong)uVar8;
              local_88 = plVar14;
              local_70 = pcVar36;
              for (plVar34 = (lys_module *)0x0; plVar34 != local_50;
                  plVar34 = (lys_module *)((long)&plVar34->ctx + 1)) {
                if ((plVar28->val).nodes[(long)plVar34].pos == 1) {
                  (plVar28->val).nodes[(long)plVar34].pos = 0;
                  plVar21 = (lys_node *)(local_48->val).nodes[(long)plVar34].node;
                  plVar18 = plVar21;
                  while (plVar18 != (lys_node *)0x0) {
                    if ((local_5c == LYXP_NODE_ROOT_CONFIG) && ((plVar18->flags & 2) != 0))
                    goto LAB_00174271;
                    LVar1 = plVar18->nodetype;
                    if ((LVar1 == LYS_CHOICE) || ((LVar1 == LYS_CASE || (LVar1 == LYS_USES)))) {
LAB_00174252:
                      plVar11 = plVar18;
                      plVar17 = plVar18->child;
                      if (plVar18->child != (lys_node *)0x0 &&
                          (plVar18->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
                      goto LAB_0017427b;
                    }
                    else if (LVar1 == LYS_OUTPUT) {
                      if ((options & 0x20U) != 0) goto LAB_00174252;
                    }
                    else if (LVar1 != LYS_GROUPING) {
                      if (LVar1 != LYS_INPUT) {
                        bVar37 = plVar18 != plVar21;
                        if (bVar37 && cStack_58 == '\0') {
                          plVar16 = lys_node_module(plVar18);
                          plVar14 = local_88;
                          if (local_88 == (lys_module *)0x0) {
                            plVar14 = lys_node_module(local_40);
                          }
                          bVar37 = bVar37 && plVar16 == plVar14;
                        }
                        if (bVar37 && cStack_58 == '\0') {
                          pcVar36 = plVar18->name;
                          iVar7 = strncmp(pcVar36,local_70,(size_t)local_68);
                          if ((iVar7 == 0) && (pcVar36[(long)local_68] == '\0')) goto LAB_0017420b;
                        }
                        else if (bVar37) {
LAB_0017420b:
                          plVar28 = local_48;
                          uVar8 = set_snode_dup_node_check
                                            (local_48,plVar18,LYXP_NODE_ELEM,(int)plVar34);
                          if ((int)uVar8 < 0) {
                            set_snode_insert_node(plVar28,plVar18,LYXP_NODE_ELEM);
                          }
                          else {
                            (plVar28->val).nodes[(long)(ulong)uVar8].pos = 1;
                            if (plVar34 < (lys_module *)(ulong)uVar8) goto LAB_00174271;
                          }
                        }
                        goto LAB_00174252;
                      }
                      if ((options & 0x20U) == 0) goto LAB_00174252;
                    }
LAB_00174271:
                    if (plVar18 == plVar21) break;
                    while( true ) {
                      plVar11 = plVar18;
                      plVar17 = plVar18->next;
LAB_0017427b:
                      plVar18 = plVar17;
                      if ((plVar18 != (lys_node *)0x0) ||
                         (plVar17 = lys_parent(plVar11), plVar17 == plVar21)) break;
                      plVar18 = lys_parent(plVar11);
                    }
                  }
                }
                plVar28 = local_48;
              }
            }
LAB_001742b7:
            iVar7 = 0;
          }
          else {
            iVar7 = moveto_node_alldesc(plVar28,(lyd_node *)local_40,pcVar36,uVar4,options);
          }
LAB_001742ba:
          if ((plVar28 == (lyxp_set *)0x0) || (iVar7 != 0)) {
            if (iVar7 != 0) {
              return iVar7;
            }
          }
          else if ((options & 0x1cU) != 0) {
            uVar19 = (ulong)plVar28->used;
            do {
              uVar19 = uVar19 - 1;
              if ((int)(uint)uVar19 < 0) {
                if (uVar19 == 0xffffffffffffffff) {
                  pcVar36 = lys_path(local_40,1);
                  uVar4 = *(ushort *)((long)local_80->tok_len + (ulong)((uint)*local_78 * 2));
                  uVar5 = *(ushort *)((long)local_80->expr_pos + (ulong)((uint)*local_78 * 2));
                  ly_log(local_90->ctx,LY_LLWRN,LY_SUCCESS,
                         "Schema node \"%.*s\" not found (%.*s) with context node \"%s\".",
                         (ulong)uVar4,local_80->expr + uVar5,(ulong)((uint)uVar5 + (uint)uVar4),
                         local_80->expr,pcVar36);
                  free(pcVar36);
                }
                break;
              }
            } while ((plVar28->val).nodes[(uint)uVar19 & 0x7fffffff].pos == 0);
          }
        }
        else if (local_31 == '\0') {
          set_snode_clear_ctx(plVar28);
        }
        else {
          uVar19 = (ulong)(uint)((int)uVar19 * 2);
          plVar23 = (ly_ctx *)(exp->expr + *(ushort *)((long)exp->expr_pos + uVar19));
          uVar4 = *(ushort *)((long)exp->tok_len + uVar19);
          uVar27 = (uint)uVar4;
          local_68 = plVar23;
          if (all_desc == 0) {
            if ((plVar28 != (lyxp_set *)0x0) && (plVar28->type != LYXP_SET_EMPTY)) {
              if (plVar28->type == LYXP_SET_NODE_SET) {
                local_50 = (lys_module *)CONCAT44(local_50._4_4_,(uint)uVar4);
                pcVar36 = strnchr((char *)plVar23,0x3a,uVar27);
                plVar21 = local_40;
                if ((local_40 == (lys_node *)0x0) || (pcVar36 == (char *)0x0)) {
                  plVar14 = (lys_module *)0x0;
                  uVar8 = (uint)local_50;
                }
                else {
                  pcVar36 = strnchr((char *)plVar23,0x3a,uVar27);
                  uVar27 = (int)pcVar36 - (int)plVar23;
                  plVar14 = moveto_resolve_model
                                      ((char *)plVar23,(uint16_t)uVar27,
                                       ((lys_node *)plVar21->name)->module->ctx,(lys_node *)0x0,0,
                                       uVar8);
                  if (plVar14 == (lys_module *)0x0) {
                    ctx = ((lys_node *)local_40->name)->module->ctx;
                    goto LAB_00174c2b;
                  }
                  plVar23 = (ly_ctx *)((long)&(plVar23->dict).hash_tab + (long)(int)uVar27 + 1);
                  uVar8 = ~uVar27 + (uint)local_50;
                }
                bVar37 = true;
                if ((short)uVar8 == 1) {
                  bVar37 = *(char *)&(plVar23->dict).hash_tab != '*';
                }
                local_70 = (char *)(ulong)(uVar8 & 0xffff);
                uVar19 = 0;
                local_68 = plVar23;
LAB_001745c8:
                if ((uint)uVar19 < plVar28->used) {
                  if (((plVar28->val).nodes[uVar19].type == LYXP_NODE_ELEM) &&
                     (plVar10 = (plVar28->val).nodes[uVar19].node, -1 < (char)plVar10->validity))
                  goto code_r0x001745f9;
                  goto LAB_001746c9;
                }
                goto LAB_001742ff;
              }
              goto LAB_00174b8e;
            }
          }
          else if ((plVar28 != (lyxp_set *)0x0) && (plVar28->type != LYXP_SET_EMPTY)) {
            if (plVar28->type == LYXP_SET_NODE_SET) {
              local_50 = (lys_module *)CONCAT44(local_50._4_4_,(uint)uVar4);
              pcVar36 = strnchr((char *)plVar23,0x3a,uVar27);
              plVar21 = local_40;
              if (pcVar36 == (char *)0x0) {
                plVar14 = (lys_module *)0x0;
              }
              else {
                pcVar36 = strnchr((char *)plVar23,0x3a,(uint)uVar4);
                uVar27 = (int)pcVar36 - (int)plVar23;
                plVar14 = moveto_resolve_model
                                    ((char *)plVar23,(uint16_t)uVar27,
                                     ((lys_node *)plVar21->name)->module->ctx,(lys_node *)0x0,0,
                                     uVar8);
                if (plVar14 == (lys_module *)0x0) {
                  ctx = ((lys_node *)local_40->name)->module->ctx;
LAB_00174c2b:
                  ly_vlog(ctx,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar27,plVar23);
                  return -1;
                }
                local_68 = (ly_ctx *)((long)&(plVar23->dict).hash_tab + (long)(int)uVar27 + 1);
                local_50 = (lys_module *)CONCAT44(local_50._4_4_,~uVar27 + (uint)local_50);
              }
              plVar20 = set_copy(plVar28);
              plVar21 = local_40;
              iVar7 = moveto_node_alldesc(plVar20,(lyd_node *)local_40,"*",1,options);
              if (iVar7 != 0) {
                lyxp_set_free(plVar20);
                return iVar7;
              }
              iVar7 = moveto_union(plVar28,plVar20,(lyd_node *)plVar21,options);
              lyxp_set_free(plVar20);
              if (iVar7 != 0) {
                return -1;
              }
              _cStack_58 = (ly_ctx *)CONCAT71(uStack_57,1);
              if ((short)local_50 == 1) {
                _cStack_58 = (ly_ctx *)
                             CONCAT71(uStack_57,*(char *)&(local_68->dict).hash_tab != '*');
              }
              local_70 = (char *)(ulong)((uint)local_50 & 0xffff);
              uVar8 = 0;
              plVar28 = local_48;
LAB_001744a4:
              if (uVar8 < plVar28->used) {
                if ((plVar28->val).nodes[uVar8].type == LYXP_NODE_ELEM) goto code_r0x001744c4;
                goto LAB_00174593;
              }
              goto LAB_001742ff;
            }
LAB_00174b8e:
            plVar23 = (ly_ctx *)**(undefined8 **)(local_40->name + 0x30);
            pcVar24 = print_set_type(plVar28);
            pcVar36 = "path operator";
            ecode = LYE_XPATH_INOP_1;
LAB_00174bea:
            ly_vlog(plVar23,ecode,LY_VLOG_NONE,(void *)0x0,pcVar36,pcVar24);
            return -1;
          }
        }
LAB_001742ff:
        puVar29 = local_78;
        plVar3 = local_80;
        pcVar36 = print_token(local_80->tokens[*local_78]);
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar24,pcVar36,
                   (ulong)plVar3->expr_pos[*puVar29]);
        plVar21 = local_40;
        plVar14 = local_90;
      }
      plVar3 = local_80;
      *puVar29 = *puVar29 + 1;
      while( true ) {
        uVar4 = plVar3->used;
        uVar5 = *puVar29;
        if ((uVar4 <= uVar5) || (plVar3->tokens[uVar5] != LYXP_TOKEN_BRACK1)) break;
        iVar7 = eval_predicate(plVar3,puVar29,(lyd_node *)plVar21,plVar14,plVar28,options,1);
        if (iVar7 != 0) {
          return iVar7;
        }
      }
      goto LAB_00174a7e;
    }
    puVar29 = local_78;
    plVar3 = local_80;
    if (lVar6 != LYXP_SET_EMPTY) {
      return lVar6;
    }
    pcVar36 = print_token(local_80->tokens[*local_78]);
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar24,pcVar36,
               (ulong)plVar3->expr_pos[*puVar29]);
    uVar5 = *puVar29 + 1;
    *puVar29 = uVar5;
    uVar4 = plVar3->used;
LAB_00174a7e:
    exp_idx = local_78;
    exp = local_80;
    if (uVar4 <= uVar5) {
      return 0;
    }
    if (local_80->tokens[uVar5] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    all_desc = 0;
    if (local_80->tok_len[uVar5] != 1) {
      if (local_80->tok_len[uVar5] != 2) {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1c06,
                      "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                     );
      }
      all_desc = 1;
    }
    set = (lyxp_set *)(ulong)local_80->expr_pos[uVar5];
    pcVar36 = "Operator(Path)";
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar24);
    uVar4 = *exp_idx + 1;
    *exp_idx = uVar4;
  } while( true );
code_r0x00173c6f:
  plVar12->type = LYXP_NODE_TEXT;
  uVar8 = uVar8 + 1;
  goto LAB_00173c1e;
code_r0x001745f9:
  iVar7 = 0;
  pplVar30 = &plVar10->attr;
  while (pcVar36 = local_70, plVar10 = (lyd_node *)*pplVar30, plVar10 != (lyd_node *)0x0) {
    if ((plVar14 == (lys_module *)0x0) || (*(lys_module **)&plVar10->attr->value_type == plVar14)) {
      if (bVar37) {
        local_50 = (lys_module *)CONCAT44(local_50._4_4_,iVar7);
        _cStack_58 = (ly_ctx *)CONCAT44(mod_idx,(int)uVar19);
        plVar2 = plVar10->next;
        iVar9 = strncmp((char *)plVar2,(char *)local_68,(size_t)local_70);
        iVar7 = (uint)local_50;
        if (iVar9 == 0) {
          uVar19 = (ulong)_cStack_58 & 0xffffffff;
          if (pcVar36[(long)&plVar2->schema] == '\0') goto LAB_00174671;
        }
        else {
          uVar19 = (ulong)_cStack_58 & 0xffffffff;
        }
      }
      else {
LAB_00174671:
        if (iVar7 == 0) {
          (local_48->val).nodes[uVar19].node = plVar10;
          (local_48->val).nodes[uVar19].type = LYXP_NODE_ATTR;
        }
        else {
          set_insert_node(local_48,plVar10,(local_48->val).nodes[uVar19].pos,LYXP_NODE_ATTR,
                          (int)uVar19 + 1);
        }
        uVar19 = (ulong)((int)uVar19 + 1);
        iVar7 = 1;
      }
    }
    pplVar30 = (lyd_attr **)&plVar10->validity;
  }
  plVar28 = local_48;
  if (iVar7 == 0) {
LAB_001746c9:
    set_remove_node(plVar28,(uint32_t)uVar19);
  }
  goto LAB_001745c8;
code_r0x001744c4:
  bVar37 = false;
  pplVar30 = &((plVar28->val).nodes[uVar8].node)->attr;
  while (pcVar36 = local_70, plVar10 = (lyd_node *)*pplVar30, plVar10 != (lyd_node *)0x0) {
    if ((plVar14 == (lys_module *)0x0) || (*(lys_module **)&plVar10->attr->value_type == plVar14)) {
      if (cStack_58 != '\0') {
        local_50 = (lys_module *)CONCAT44(local_50._4_4_,uVar8);
        plVar2 = plVar10->next;
        iVar7 = strncmp((char *)plVar2,(char *)local_68,(size_t)local_70);
        plVar28 = local_48;
        uVar8 = (uint)local_50;
        if ((iVar7 != 0) || (pcVar36[(long)&plVar2->schema] != '\0')) goto LAB_00174581;
      }
      if (bVar37) {
        set_insert_node(plVar28,plVar10,(plVar28->val).nodes[uVar8].pos,LYXP_NODE_ATTR,uVar8 + 1);
      }
      else {
        (plVar28->val).nodes[uVar8].node = plVar10;
        (plVar28->val).nodes[uVar8].type = LYXP_NODE_ATTR;
      }
      bVar37 = true;
      uVar8 = uVar8 + 1;
    }
LAB_00174581:
    pplVar30 = (lyd_attr **)&plVar10->validity;
  }
  if (!bVar37) {
LAB_00174593:
    set_remove_node(plVar28,uVar8);
  }
  goto LAB_001744a4;
LAB_00174052:
  uVar25 = uVar19 << 4 | 8;
  do {
    uVar27 = (uint)uVar19;
    if (uVar8 - 1 <= uVar27) {
      if (!bVar37) {
LAB_00174d10:
        __assert_fail("!set_sort(set, cur_node, options) && !set_sorted_dup_node_clean(set)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x192d,"int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)");
      }
      goto LAB_001740ab;
    }
    plVar12 = (plVar28->val).nodes;
    uVar31 = (ulong)(uVar27 + 1);
    if ((*(lyd_node **)((long)plVar12 + (uVar25 - 8)) == plVar12[uVar31].node) &&
       (*(lyxp_node_type *)((long)&plVar12->node + uVar25) == plVar12[uVar31].type)) break;
    uVar25 = uVar25 + 0x10;
    uVar19 = uVar31;
  } while( true );
  set_remove_node(plVar28,uVar27 + 1);
  uVar8 = plVar28->used;
  bVar37 = false;
  goto LAB_00174052;
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }

            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options, 1);
                if (ret) {
                    return ret;
                }
            }
            break;

        default:
            LOGINT(local_mod ? local_mod->ctx : NULL);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}